

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

int FnMeanSigma_int(int *array,long npix,int nullcheck,int nullvalue,long *ngoodpix,double *mean,
                   double *sigma,int *status)

{
  long extraout_RAX;
  long lVar1;
  long lVar2;
  int *value;
  double dVar3;
  double dVar4;
  double dVar5;
  
  lVar1 = 0;
  if (0 < npix) {
    lVar1 = npix;
  }
  dVar4 = 0.0;
  if (nullcheck == 0) {
    dVar3 = 0.0;
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      dVar5 = (double)array[lVar2];
      dVar4 = dVar4 + dVar5;
      dVar3 = dVar3 + dVar5 * dVar5;
    }
  }
  else {
    npix = 0;
    dVar3 = 0.0;
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      if (array[lVar2] != nullvalue) {
        dVar5 = (double)array[lVar2];
        npix = npix + 1;
        dVar4 = dVar4 + dVar5;
        dVar3 = dVar3 + dVar5 * dVar5;
      }
    }
  }
  if (npix < 2) {
    if (npix == 1) {
      if (ngoodpix != (long *)0x0) {
        *ngoodpix = 1;
      }
      if (mean != (double *)0x0) {
        *mean = dVar4;
      }
    }
    else {
      if (ngoodpix != (long *)0x0) {
        *ngoodpix = 0;
      }
      if (mean != (double *)0x0) {
        *mean = 0.0;
      }
    }
    dVar4 = 0.0;
    if (sigma == (double *)0x0) goto LAB_001b12cf;
  }
  else {
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = npix;
    }
    dVar4 = dVar4 / (double)npix;
    if (mean != (double *)0x0) {
      *mean = dVar4;
    }
    if (sigma == (double *)0x0) goto LAB_001b12cf;
    dVar4 = dVar3 / (double)npix - dVar4 * dVar4;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
      lVar1 = extraout_RAX;
    }
    else {
      dVar4 = SQRT(dVar4);
    }
  }
  *sigma = dVar4;
LAB_001b12cf:
  return (int)lVar1;
}

Assistant:

static int FnMeanSigma_int
       (int *array,       /*  2 dimensional array of image pixels */
        long npix,          /* number of pixels in the image */
	int nullcheck,      /* check for null values, if true */
	int nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters */
   
	long *ngoodpix,     /* number of non-null pixels in the image */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	int *status)        /* error status */

/*
Compute mean and RMS sigma of the non-null pixels in the input array.
*/
{
	long ii, ngood = 0;
	int *value;
	double sum = 0., sum2 = 0., xtemp;

	value = array;
	    
	if (nullcheck) {
	        for (ii = 0; ii < npix; ii++, value++) {
		    if (*value != nullvalue) {
		        ngood++;
		        xtemp = (double) *value;
		        sum += xtemp;
		        sum2 += (xtemp * xtemp);
		    }
		}
	} else {
	        ngood = npix;
	        for (ii = 0; ii < npix; ii++, value++) {
		        xtemp = (double) *value;
		        sum += xtemp;
		        sum2 += (xtemp * xtemp);
		}
	}

	if (ngood > 1) {
		if (ngoodpix) *ngoodpix = ngood;
		xtemp = sum / ngood;
		if (mean)     *mean = xtemp;
		if (sigma)    *sigma = sqrt((sum2 / ngood) - (xtemp * xtemp));
	} else if (ngood == 1){
		if (ngoodpix) *ngoodpix = 1;
		if (mean)     *mean = sum;
		if (sigma)    *sigma = 0.0;
	} else {
		if (ngoodpix) *ngoodpix = 0;
	        if (mean)     *mean = 0.;
		if (sigma)    *sigma = 0.;
	}	    
	return(*status);
}